

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall Fluid::pressure_solve(Fluid *this)

{
  Program *this_00;
  Program *this_01;
  int iVar1;
  bool bVar2;
  
  this_00 = &this->jacobi_iterate_program;
  gfx::Program::use(this_00);
  set_common_uniforms(this,this_00);
  gfx::Program::validate(this_00);
  this_01 = &this->pressure_to_guess_program;
  gfx::Program::use(this_01);
  set_common_uniforms(this,this_01);
  gfx::Program::validate(this_01);
  iVar1 = 0x28;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    (*glad_glMemoryBarrier)(0xffffffff);
    gfx::Program::use(this_00);
    (*glad_glDispatchCompute)
              ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
               (this->grid_dimensions).field_2.z);
    (*glad_glMemoryBarrier)(0xffffffff);
    gfx::Program::use(this_01);
    (*glad_glDispatchCompute)
              ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
               (this->grid_dimensions).field_2.z);
  }
  return;
}

Assistant:

void pressure_solve() {
        const int iters = 40;

        jacobi_iterate_program.use();
        set_common_uniforms(jacobi_iterate_program);
        jacobi_iterate_program.validate();

        pressure_to_guess_program.use();
        set_common_uniforms(pressure_to_guess_program);
        pressure_to_guess_program.validate();

        for (int i = 0; i < iters; ++i) {
            ssbo_barrier();
            jacobi_iterate_program.use();
            glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);

            ssbo_barrier();
            pressure_to_guess_program.use();
            glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        }
    }